

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int nonce_function_ecdsa_adaptor
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *pk33,uchar *algo,size_t algolen,
              void *data)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  secp256k1_sha256 sha;
  uchar masked_key [32];
  secp256k1_sha256 local_c0;
  byte local_58 [40];
  
  if (algo == (uchar *)0x0) {
    return 0;
  }
  puVar5 = pk33;
  if (data != (void *)0x0) {
    local_c0.s[0] = 0xd14c7bd9;
    local_c0.s[1] = 0x95d35e6;
    local_c0.s[2] = 0xb8490a88;
    local_c0.s[3] = 0xfb00ef74;
    local_c0.s[4] = 0xbaa488f;
    local_c0.s[5] = 0x69366693;
    local_c0.s[6] = 0x1c81c5ba;
    local_c0.s[7] = 0xc33b296a;
    local_c0.bytes = 0x40;
    secp256k1_sha256_write(&local_c0,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_c0,local_58);
    lVar3 = 0;
    do {
      puVar5 = (uchar *)CONCAT71((int7)((ulong)puVar5 >> 8),key32[lVar3]);
      local_58[lVar3] = local_58[lVar3] ^ key32[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
  }
  if (algolen == 4) {
    lVar3 = 0;
    do {
      puVar6 = (uchar *)((ulong)puVar5 & 0xffffffff);
      bVar1 = algo[lVar3];
      bVar2 = "DLEQ"[lVar3];
      puVar5 = (uchar *)(ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        puVar5 = puVar6;
      }
      iVar4 = (int)puVar5;
      if (bVar1 != bVar2) goto LAB_001215e3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    iVar4 = 0;
LAB_001215e3:
    if (iVar4 == 0) {
      local_c0.s[0] = 0x8cc4beac;
      local_c0.s[1] = 0x2e011f3f;
      local_c0.s[2] = 0x355c75fb;
      local_c0.s[3] = 0x3ba6a2c5;
      local_c0.s[4] = 0xe96f3aef;
      local_c0.s[5] = 0x180530fd;
      local_c0.s[6] = 0x94582499;
      local_c0.s[7] = 0x577fd564;
LAB_00121648:
      local_c0.bytes = 0x40;
      goto LAB_00121656;
    }
  }
  else if (algolen == 0x10) {
    lVar3 = 0;
    do {
      iVar4 = (uint)algo[lVar3] - (uint)"ECDSAadaptor/non"[lVar3];
      if (algo[lVar3] != "ECDSAadaptor/non"[lVar3]) goto LAB_001215ab;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    iVar4 = 0;
LAB_001215ab:
    if (iVar4 == 0) {
      local_c0.s[0] = 0x791dae43;
      local_c0.s[1] = 0xe52d3b44;
      local_c0.s[2] = 0x37f9edea;
      local_c0.s[3] = 0x9bfd2ab1;
      local_c0.s[4] = 0xcfb0f44d;
      local_c0.s[5] = 0xccf1d880;
      local_c0.s[6] = 0xd18f2c13;
      local_c0.s[7] = 0xa37b9024;
      goto LAB_00121648;
    }
  }
  secp256k1_sha256_initialize_tagged(&local_c0,algo,algolen);
LAB_00121656:
  if (data != (void *)0x0) {
    key32 = local_58;
  }
  secp256k1_sha256_write(&local_c0,key32,0x20);
  secp256k1_sha256_write(&local_c0,pk33,0x21);
  secp256k1_sha256_write(&local_c0,msg32,0x20);
  secp256k1_sha256_finalize(&local_c0,nonce32);
  return 1;
}

Assistant:

static int nonce_function_ecdsa_adaptor(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *pk33, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithims. An optimized tagging implementation is used if the default
     * tag is provided. */
    if (algolen == sizeof(ecdsa_adaptor_algo)
            && secp256k1_memcmp_var(algo, ecdsa_adaptor_algo, algolen) == 0) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged(&sha);
    } else if (algolen == sizeof(dleq_algo)
            && secp256k1_memcmp_var(algo, dleq_algo, algolen) == 0) {
        secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per BIP-340 */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, pk33, 33);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}